

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
                *prod,Matrix<double,__1,_1,_0,__1,_1> *dest,Scalar *alpha)

{
  ulong uVar1;
  LhsNested pMVar2;
  RhsNested pMVar3;
  double *lhs;
  long rows;
  long cols;
  double *rhs;
  double *pdVar4;
  undefined8 *puVar5;
  double *__ptr;
  double *pdVar6;
  Scalar alpha_00;
  double dStack_38;
  Scalar local_30;
  
  pdVar6 = &dStack_38;
  uVar1 = (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar1 >> 0x3d == 0) {
    pMVar2 = (prod->
             super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ).m_lhs;
    pMVar3 = (prod->
             super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ).m_rhs;
    alpha_00 = *alpha;
    pdVar4 = (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    if (pdVar4 == (double *)0x0) {
      if (uVar1 < 0x4001) {
        pdVar4 = (double *)((long)&dStack_38 - (uVar1 * 8 + 0xf & 0xfffffffffffffff0));
        __ptr = pdVar4;
        pdVar6 = pdVar4;
      }
      else {
        local_30 = alpha_00;
        pdVar4 = (double *)malloc(uVar1 * 8);
        __ptr = pdVar4;
        alpha_00 = local_30;
        if (pdVar4 == (double *)0x0) goto LAB_001075b7;
      }
    }
    else {
      __ptr = (double *)0x0;
      pdVar6 = &dStack_38;
    }
    lhs = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_data;
    rows = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
    cols = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    rhs = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar6[-1] = 4.94065645841247e-324;
    pdVar6[-2] = (double)pdVar4;
    pdVar6[-3] = 5.32937248659098e-318;
    general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
              (rows,cols,lhs,rows,rhs,1,(ResScalar *)pdVar6[-2],(long)pdVar6[-1],alpha_00);
    if (0x4000 < uVar1) {
      pdVar6[-1] = 5.32947624037661e-318;
      free(__ptr);
    }
    return;
  }
LAB_001075b7:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = operator_delete;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }